

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_content_type.cpp
# Opt level: O0

string * __thiscall cppcms::http::content_type::subtype_abi_cxx11_(content_type *this)

{
  bool bVar1;
  element_type *peVar2;
  __shared_ptr *in_RSI;
  string *in_RDI;
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool(in_RSI);
  if (bVar1) {
    peVar2 = std::
             __shared_ptr_access<cppcms::http::content_type::data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<cppcms::http::content_type::data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x3cb859);
    std::__cxx11::string::string((string *)in_RDI,(string *)&peVar2->subtype);
  }
  else {
    std::__cxx11::string::string((string *)in_RDI);
  }
  return in_RDI;
}

Assistant:

std::string content_type::subtype() const
	{
		if(d)
			return d->subtype;
		return std::string();
	}